

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple.h
# Opt level: O0

void __thiscall
kj::_::
TupleImpl<kj::_::Indexes<0ul,1ul,2ul>,kj::Maybe<capnp::Orphan<capnp::compiler::LocatedInteger>>,bool,bool>
::TupleImpl<kj::None,bool,bool>
          (TupleImpl<kj::_::Indexes<0ul,1ul,2ul>,kj::Maybe<capnp::Orphan<capnp::compiler::LocatedInteger>>,bool,bool>
           *this,Tuple<kj::None,_bool,_bool> *other)

{
  TypeByIndex<0UL,_kj::None,_bool,_bool> *t;
  TypeByIndex<1UL,_kj::None,_bool,_bool> *t_00;
  bool *pbVar1;
  TypeByIndex<2UL,_kj::None,_bool,_bool> *t_01;
  Maybe<capnp::Orphan<capnp::compiler::LocatedInteger>_> local_40;
  Tuple<kj::None,_bool,_bool> *local_18;
  Tuple<kj::None,_bool,_bool> *other_local;
  TupleImpl<kj::_::Indexes<0UL,_1UL,_2UL>,_kj::Maybe<capnp::Orphan<capnp::compiler::LocatedInteger>_>,_bool,_bool>
  *this_local;
  
  local_18 = other;
  other_local = (Tuple<kj::None,_bool,_bool> *)this;
  t = getImpl<0ul,kj::None,bool,bool>(other);
  fwd<kj::None>(t);
  Maybe<capnp::Orphan<capnp::compiler::LocatedInteger>_>::Maybe();
  TupleElement<0U,_kj::Maybe<capnp::Orphan<capnp::compiler::LocatedInteger>_>_>::TupleElement
            ((TupleElement<0U,_kj::Maybe<capnp::Orphan<capnp::compiler::LocatedInteger>_>_> *)this,
             &local_40);
  Maybe<capnp::Orphan<capnp::compiler::LocatedInteger>_>::~Maybe(&local_40);
  t_00 = getImpl<1ul,kj::None,bool,bool>(local_18);
  pbVar1 = fwd<bool>(t_00);
  TupleElement<1U,_bool>::TupleElement((TupleElement<1U,_bool> *)(this + 0x28),pbVar1);
  t_01 = getImpl<2ul,kj::None,bool,bool>(local_18);
  pbVar1 = fwd<bool>(t_01);
  TupleElement<2U,_bool>::TupleElement((TupleElement<2U,_bool> *)(this + 0x29),pbVar1);
  return;
}

Assistant:

constexpr inline TupleImpl(Tuple<U...>&& other)
      : TupleElement<indexes, Types>(kj::fwd<U>(getImpl<indexes>(other)))... {}